

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

void palette_rd_y(AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mbmi,BLOCK_SIZE bsize,int dc_mode_cost,
                 int16_t *data,int16_t *centroids,int n,uint16_t *color_cache,int n_cache,
                 _Bool do_header_rd_based_gating,MB_MODE_INFO *best_mbmi,
                 uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,int *rate_tokenonly,
                 int64_t *distortion,uint8_t *skippable,int *beat_best_rd,PICK_MODE_CONTEXT *ctx,
                 uint8_t *blk_skip,uint8_t *tx_type_map,int *beat_best_palette_rd,
                 _Bool *do_header_rd_based_breakout,int discount_color_cost)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  _Bool _Var4;
  SequenceHeader *pSVar5;
  uint8_t *__src;
  MB_MODE_INFO *pMVar6;
  WinnerModeStats *pWVar7;
  byte bVar8;
  aom_bit_depth_t aVar9;
  int64_t *piVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint8_t *puVar14;
  uint8_t *__src_00;
  uint uVar15;
  byte bVar16;
  ushort uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  byte bVar21;
  int i_1;
  int iVar22;
  ulong uVar23;
  uint16_t uVar24;
  ulong uVar25;
  size_t __n;
  int iVar26;
  uint uVar27;
  bool bVar28;
  uint local_90;
  RD_STATS local_58;
  
  if (do_header_rd_based_breakout != (_Bool *)0x0) {
    *do_header_rd_based_breakout = false;
  }
  if (0 < n && 0 < n_cache) {
    aVar9 = ((cpi->common).seq_params)->bit_depth;
    uVar18 = 0;
    do {
      iVar22 = (int)centroids[uVar18] - (uint)*color_cache;
      iVar19 = -iVar22;
      if (0 < iVar22) {
        iVar19 = iVar22;
      }
      if (n_cache == 1) {
        lVar11 = 0;
      }
      else {
        uVar23 = 0;
        uVar25 = 1;
        do {
          iVar26 = (int)centroids[uVar18] - (uint)color_cache[uVar25];
          iVar22 = -iVar26;
          if (0 < iVar26) {
            iVar22 = iVar26;
          }
          if (iVar22 < iVar19) {
            uVar23 = uVar25 & 0xffffffff;
            iVar19 = iVar22;
          }
          uVar25 = uVar25 + 1;
        } while ((uint)n_cache != uVar25);
        lVar11 = (long)(int)uVar23;
      }
      if (iVar19 <= 4 << ((char)aVar9 - AOM_BITS_8 & 0x1f)) {
        centroids[uVar18] = color_cache[lVar11];
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)n);
  }
  qsort(centroids,(long)n,2,int16_comparer);
  uVar20 = 1;
  if (1 < n) {
    uVar18 = 1;
    do {
      if (centroids[uVar18] != centroids[uVar18 - 1]) {
        lVar11 = (long)(int)uVar20;
        uVar20 = uVar20 + 1;
        centroids[lVar11] = centroids[uVar18];
      }
      uVar18 = uVar18 + 1;
    } while ((uint)n != uVar18);
  }
  if ((int)uVar20 < 2) {
    return;
  }
  pSVar5 = (cpi->common).seq_params;
  if (pSVar5->use_highbitdepth == '\0') {
    uVar18 = 0;
    do {
      uVar17 = centroids[uVar18];
      if (centroids[uVar18] < 1) {
        uVar17 = 0;
      }
      if (0xfe < uVar17) {
        uVar17 = 0xff;
      }
      (mbmi->palette_mode_info).palette_colors[uVar18] = uVar17;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  else {
    aVar9 = pSVar5->bit_depth;
    uVar18 = 0;
    do {
      uVar24 = centroids[uVar18];
      if (aVar9 == AOM_BITS_10) {
        if (0x3fe < (short)uVar24) {
          uVar24 = 0x3ff;
        }
      }
      else if (aVar9 == AOM_BITS_12) {
        if (0xffe < (short)uVar24) {
          uVar24 = 0xfff;
        }
      }
      else if (0xfe < (short)uVar24) {
        uVar24 = 0xff;
      }
      if ((short)uVar24 < 1) {
        uVar24 = 0;
      }
      (mbmi->palette_mode_info).palette_colors[uVar18] = uVar24;
      uVar18 = uVar18 + 1;
    } while (uVar20 != uVar18);
  }
  (mbmi->palette_mode_info).palette_size[0] = (uint8_t)uVar20;
  bVar1 = block_size_high[bsize];
  bVar2 = block_size_wide[bsize];
  iVar19 = (x->e_mbd).mb_to_bottom_edge;
  iVar22 = (x->e_mbd).mb_to_right_edge;
  bVar16 = (byte)(x->e_mbd).plane[0].subsampling_x;
  bVar21 = (byte)(x->e_mbd).plane[0].subsampling_y;
  uVar15 = (uint)(bVar2 >> (bVar16 & 0x1f));
  bVar8 = bVar1 >> (bVar21 & 0x1f);
  uVar27 = (int)((iVar19 >> 0x1f & iVar19 >> 3) + (uint)bVar1) >> (bVar21 & 0x1f);
  uVar12 = (int)((iVar22 >> 0x1f & iVar22 >> 3) + (uint)bVar2) >> (bVar16 & 0x1f);
  __src = (x->e_mbd).plane[0].color_index_map;
  (*av1_calc_indices_dim1)(data,centroids,__src,(int64_t *)0x0,uVar12 * uVar27,uVar20);
  if ((bVar8 != uVar27) || (uVar15 != uVar12)) {
    uVar18 = (ulong)uVar15;
    if (0 < (int)uVar27) {
      __n = (size_t)(int)uVar12;
      lVar11 = (ulong)uVar27 + 1;
      lVar13 = (ulong)uVar27 - 1;
      __src_00 = __src + lVar13 * __n;
      puVar14 = __src + lVar13 * uVar18;
      do {
        memmove(puVar14,__src_00,__n);
        memset(puVar14 + __n,(uint)puVar14[__n - 1],(long)(int)(uVar15 - uVar12));
        lVar11 = lVar11 + -1;
        __src_00 = __src_00 + -__n;
        puVar14 = puVar14 + -uVar18;
      } while (1 < lVar11);
    }
    local_90 = (uint)bVar8;
    if ((int)uVar27 < (int)local_90) {
      lVar11 = (ulong)bVar8 - (long)(int)uVar27;
      puVar14 = __src + (long)(int)uVar27 * uVar18;
      do {
        memcpy(puVar14,__src + (int)((uVar27 - 1) * uVar15),uVar18);
        puVar14 = puVar14 + uVar18;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  if (do_header_rd_based_gating) {
    iVar22 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
    if (*best_rd <
        ((long)x->rdmult * (long)iVar22 + 0x100 >> 9) >>
        ((cpi->sf).intra_sf.prune_luma_palette_size_search_level == 1)) {
      *do_header_rd_based_breakout = true;
      bVar28 = false;
    }
    else {
      av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_58,bsize,*best_rd);
      bVar28 = local_58.rate != 0x7fffffff;
      iVar22 = iVar22 + local_58.rate;
    }
    if (!bVar28) {
      return;
    }
  }
  else {
    av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_58,bsize,*best_rd);
    iVar19 = local_58.rate;
    if (local_58.rate == 0x7fffffff) {
      return;
    }
    iVar22 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,dc_mode_cost,discount_color_cost);
    iVar22 = iVar22 + iVar19;
  }
  lVar11 = local_58.dist * 0x80 + ((long)x->rdmult * (long)iVar22 + 0x100 >> 9);
  if (((x->e_mbd).lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0) && (mbmi->bsize != BLOCK_4X4)) {
    iVar19 = 0;
    if ((bsize != BLOCK_4X4) && (iVar19 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02'))
    {
      lVar13 = 0;
      for (bVar16 = ""[bsize]; bVar16 != mbmi->tx_size; bVar16 = ""[bVar16]) {
        lVar13 = lVar13 + 1;
      }
      _Var3 = (x->e_mbd).up_available;
      _Var4 = (x->e_mbd).left_available;
      bVar16 = *(x->e_mbd).above_txfm_context;
      if ((_Var3 == true) &&
         ((pMVar6 = (x->e_mbd).above_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar6->ref_frame[0])))) {
        bVar16 = block_size_wide[pMVar6->bsize];
      }
      bVar21 = *(x->e_mbd).left_txfm_context;
      if ((_Var4 != false) &&
         ((pMVar6 = (x->e_mbd).left_mbmi, (pMVar6->field_0xa7 & 0x80) != 0 ||
          ('\0' < pMVar6->ref_frame[0])))) {
        bVar21 = block_size_high[pMVar6->bsize];
      }
      iVar19 = *(int *)((long)(x->mode_costs).skip_txfm_cost +
                       lVar13 * 4 +
                       (ulong)(byte)(_Var3 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                             (int)(uint)bVar16) * 0x14 +
                       (ulong)(byte)(_Var4 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                             (int)(uint)bVar21) * 0x14 +
                       (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c
                       + -0x24);
    }
    local_58.rate = local_58.rate - iVar19;
  }
  uVar18 = (ulong)(cpi->sf).winner_mode_sf.multi_winner_mode_type;
  if ((lVar11 != 0x7fffffffffffffff && uVar18 != 0) &&
     ((pWVar7 = x->winner_mode_stats, ((cpi->common).current_frame.frame_type & 0xfd) == 0 ||
      ((mbmi->palette_mode_info).palette_size[0] == '\0')))) {
    uVar20 = winner_mode_count_allowed[uVar18];
    uVar12 = x->winner_mode_count;
    if ((ulong)uVar12 == 0) {
      uVar18 = 0;
    }
    else {
      if ((int)uVar12 < 1) {
        uVar18 = 0;
      }
      else {
        piVar10 = &pWVar7->rd;
        uVar18 = 0;
        do {
          if (lVar11 < *piVar10) goto LAB_001e38bb;
          uVar18 = uVar18 + 1;
          piVar10 = piVar10 + 0x81e;
        } while (uVar12 != uVar18);
        uVar18 = (ulong)uVar12;
      }
LAB_001e38bb:
      uVar12 = (uint)uVar18;
      if (uVar12 == uVar20) goto LAB_001e3982;
      if ((int)uVar12 < (int)(uVar20 - 1)) {
        memmove(pWVar7 + (uVar18 & 0xffffffff) + 1,pWVar7 + (uVar18 & 0xffffffff),
                (long)(int)(~uVar12 + uVar20) * 0x40f0);
      }
    }
    uVar18 = uVar18 & 0xffffffff;
    memcpy(pWVar7 + uVar18,mbmi,0xb0);
    pWVar7[uVar18].rd = lVar11;
    pWVar7[uVar18].mode_index = 0x9c;
    if (__src != (uint8_t *)0x0) {
      memcpy(pWVar7[uVar18].color_index_map,__src,
             (ulong)((uint)(bVar1 >> ((byte)(x->e_mbd).plane[0].subsampling_y & 0x1f)) *
                    (uint)(bVar2 >> ((byte)(x->e_mbd).plane[0].subsampling_x & 0x1f))));
    }
    uVar12 = x->winner_mode_count + 1;
    if ((int)uVar20 <= (int)uVar12) {
      uVar12 = uVar20;
    }
    x->winner_mode_count = uVar12;
  }
LAB_001e3982:
  if (lVar11 < *best_rd) {
    *best_rd = lVar11;
    if (beat_best_rd != (int *)0x0) {
      *beat_best_rd = 1;
    }
    memcpy(best_palette_color_map,__src,(ulong)(bVar8 * uVar15));
    memcpy(best_mbmi,mbmi,0xb0);
    memcpy(blk_skip,(x->txfm_search_info).blk_skip,(long)ctx->num_4x4_blk);
    memcpy(tx_type_map,(x->e_mbd).tx_type_map,(long)ctx->num_4x4_blk);
    if (rate != (int *)0x0) {
      *rate = iVar22;
    }
    if (rate_tokenonly != (int *)0x0) {
      *rate_tokenonly = local_58.rate;
    }
    if (distortion != (int64_t *)0x0) {
      *distortion = local_58.dist;
    }
    if (skippable != (uint8_t *)0x0) {
      *skippable = local_58.skip_txfm;
    }
    if (beat_best_palette_rd != (int *)0x0) {
      *beat_best_palette_rd = 1;
    }
  }
  return;
}

Assistant:

static inline void palette_rd_y(
    const AV1_COMP *const cpi, MACROBLOCK *x, MB_MODE_INFO *mbmi,
    BLOCK_SIZE bsize, int dc_mode_cost, const int16_t *data, int16_t *centroids,
    int n, uint16_t *color_cache, int n_cache, bool do_header_rd_based_gating,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *blk_skip,
    uint8_t *tx_type_map, int *beat_best_palette_rd,
    bool *do_header_rd_based_breakout, int discount_color_cost) {
  if (do_header_rd_based_breakout != NULL) *do_header_rd_based_breakout = false;
  optimize_palette_colors(color_cache, n_cache, n, 1, centroids,
                          cpi->common.seq_params->bit_depth);
  const int num_unique_colors = remove_duplicates(centroids, n);
  if (num_unique_colors < PALETTE_MIN_SIZE) {
    // Too few unique colors to create a palette. And DC_PRED will work
    // well for that case anyway. So skip.
    return;
  }
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  if (cpi->common.seq_params->use_highbitdepth) {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel_highbd(
          (int)centroids[i], cpi->common.seq_params->bit_depth);
    }
  } else {
    for (int i = 0; i < num_unique_colors; ++i) {
      pmi->palette_colors[i] = clip_pixel(centroids[i]);
    }
  }
  pmi->palette_size[0] = num_unique_colors;
  MACROBLOCKD *const xd = &x->e_mbd;
  uint8_t *const color_map = xd->plane[0].color_index_map;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  av1_calc_indices(data, centroids, color_map, rows * cols, num_unique_colors,
                   1);
  extend_palette_color_map(color_map, cols, rows, block_width, block_height);

  RD_STATS tokenonly_rd_stats;
  int this_rate;

  if (do_header_rd_based_gating) {
    assert(do_header_rd_based_breakout != NULL);
    const int palette_mode_rate = intra_mode_info_cost_y(
        cpi, x, mbmi, bsize, dc_mode_cost, discount_color_cost);
    const int64_t header_rd = RDCOST(x->rdmult, palette_mode_rate, 0);
    // Less aggressive pruning when prune_luma_palette_size_search_level == 1.
    const int header_rd_shift =
        (cpi->sf.intra_sf.prune_luma_palette_size_search_level == 1) ? 1 : 0;
    // Terminate further palette_size search, if the header cost corresponding
    // to lower palette_size is more than *best_rd << header_rd_shift. This
    // logic is implemented with a right shift in the LHS to prevent a possible
    // overflow with the left shift in RHS.
    if ((header_rd >> header_rd_shift) > *best_rd) {
      *do_header_rd_based_breakout = true;
      return;
    }
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate + palette_mode_rate;
  } else {
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &tokenonly_rd_stats, bsize,
                                      *best_rd);
    if (tokenonly_rd_stats.rate == INT_MAX) return;
    this_rate = tokenonly_rd_stats.rate +
                intra_mode_info_cost_y(cpi, x, mbmi, bsize, dc_mode_cost,
                                       discount_color_cost);
  }

  int64_t this_rd = RDCOST(x->rdmult, this_rate, tokenonly_rd_stats.dist);
  if (!xd->lossless[mbmi->segment_id] && block_signals_txsize(mbmi->bsize)) {
    tokenonly_rd_stats.rate -= tx_size_cost(x, bsize, mbmi->tx_size);
  }
  // Collect mode stats for multiwinner mode processing
  const int txfm_search_done = 1;
  store_winner_mode_stats(
      &cpi->common, x, mbmi, NULL, NULL, NULL, THR_DC, color_map, bsize,
      this_rd, cpi->sf.winner_mode_sf.multi_winner_mode_type, txfm_search_done);
  if (this_rd < *best_rd) {
    *best_rd = this_rd;
    // Setting beat_best_rd flag because current mode rd is better than best_rd.
    // This flag need to be updated only for palette evaluation in key frames
    if (beat_best_rd) *beat_best_rd = 1;
    memcpy(best_palette_color_map, color_map,
           block_width * block_height * sizeof(color_map[0]));
    *best_mbmi = *mbmi;
    memcpy(blk_skip, x->txfm_search_info.blk_skip,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    av1_copy_array(tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
    if (rate) *rate = this_rate;
    if (rate_tokenonly) *rate_tokenonly = tokenonly_rd_stats.rate;
    if (distortion) *distortion = tokenonly_rd_stats.dist;
    if (skippable) *skippable = tokenonly_rd_stats.skip_txfm;
    if (beat_best_palette_rd) *beat_best_palette_rd = 1;
  }
}